

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

subsector_t * R_PointInSubsector(fixed_t x,fixed_t y)

{
  int iVar1;
  node_t *node;
  subsector_t *psVar2;
  
  psVar2 = subsectors;
  if ((long)numnodes != 0) {
    node = nodes + (long)numnodes + -1;
    do {
      iVar1 = R_PointOnSide(x,y,node);
      node = *(node_t **)((long)&node->field_6 + (long)iVar1 * 8);
    } while (((ulong)node & 1) == 0);
    psVar2 = (subsector_t *)((long)&node[-1].field_6 + 0xf);
  }
  return psVar2;
}

Assistant:

subsector_t *R_PointInSubsector (fixed_t x, fixed_t y)
{
	node_t *node;
	int side;

	// single subsector is a special case
	if (numnodes == 0)
		return subsectors;
				
	node = nodes + numnodes - 1;

	do
	{
		side = R_PointOnSide (x, y, node);
		node = (node_t *)node->children[side];
	}
	while (!((size_t)node & 1));
		
	return (subsector_t *)((BYTE *)node - 1);
}